

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O2

void __thiscall
FIX::Session::populateRejectReason(Session *this,Message *reject,int field,string *text)

{
  bool bVar1;
  MsgType *pMVar2;
  ostream *poVar3;
  STRING local_220;
  FieldBase local_200;
  stringstream stream;
  ostream local_198 [376];
  
  pMVar2 = FieldMap::getField<FIX::MsgType>(&(reject->m_header).super_FieldMap);
  bVar1 = std::operator==(&(pMVar2->super_StringField).super_FieldBase.m_string,"3");
  if ((bVar1) &&
     (bVar1 = std::operator>=(&(this->m_sessionID).m_beginString.super_StringField.super_FieldBase.
                               m_string,"FIX.4.2"), bVar1)) {
    RefTagID::RefTagID((RefTagID *)&stream,field);
    FieldMap::setField(&reject->super_FieldMap,(FieldBase *)&stream,true);
    FieldBase::~FieldBase((FieldBase *)&stream);
    Text::Text((Text *)&stream,text);
    FieldMap::setField(&reject->super_FieldMap,(FieldBase *)&stream,true);
    FieldBase::~FieldBase((FieldBase *)&stream);
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  poVar3 = std::operator<<(local_198,(string *)text);
  poVar3 = std::operator<<(poVar3," (");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,field);
  std::operator<<(poVar3,")");
  std::__cxx11::stringbuf::str();
  Text::Text((Text *)&local_200,&local_220);
  FieldMap::setField(&reject->super_FieldMap,&local_200,true);
  FieldBase::~FieldBase(&local_200);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  return;
}

Assistant:

void Session::populateRejectReason(Message &reject, int field, const std::string &text) {
  auto const &msgType = reject.getHeader().getField<MsgType>();

  if (msgType == MsgType_Reject && m_sessionID.getBeginString() >= FIX::BeginString_FIX42) {
    reject.setField(RefTagID(field));
    reject.setField(Text(text));
  } else {
    std::stringstream stream;
    stream << text << " (" << field << ")";
    reject.setField(Text(stream.str()));
  }
}